

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

void __thiscall
draco::ObjEncoder::FindOriginalFaceEdges
          (ObjEncoder *this,FaceIndex face_index,CornerTable *corner_table,
          vector<bool,_std::allocator<bool>_> *triangle_visited,PolygonEdges *polygon_edges)

{
  _Bit_type *p_Var1;
  pointer paVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  CornerIndex ci;
  ulong uVar6;
  CornerTable *ct;
  ulong uVar7;
  CornerIndex ci_00;
  long lVar8;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_50;
  undefined4 local_4c;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> *local_48;
  CornerTable *local_40;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  uVar7 = (ulong)face_index.value_;
  p_Var1 = (triangle_visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar6 = p_Var1[face_index.value_ >> 6];
  if ((uVar6 >> (uVar7 & 0x3f) & 1) == 0) {
    p_Var1[face_index.value_ >> 6] = uVar6 | 1L << ((byte)face_index.value_ & 0x3f);
    paVar2 = (this->in_mesh_->faces_).vector_.
             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ct = (CornerTable *)(paVar2 + uVar7);
    uVar6 = (ulong)(face_index.value_ * 3);
    if (face_index.value_ == 0xffffffff) {
      uVar6 = uVar7;
    }
    local_48 = paVar2[uVar7]._M_elems + 2;
    uVar7 = 2;
    lVar8 = 0;
    local_40 = ct;
    local_38 = triangle_visited;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar7;
      ci.value_ = (uint)(uVar6 + lVar8);
      if (ci.value_ == 0xffffffff) {
        ci_00.value_ = 0xffffffff;
      }
      else {
        ci_00.value_ = (corner_table->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6 + lVar8 & 0xffffffff].value_;
      }
      bVar4 = IsNewEdge(this,ct,ci);
      if ((!bVar4) && (ci_00.value_ != 0xffffffff)) {
        bVar4 = IsNewEdge(this,ct,ci_00);
      }
      if ((bVar4 == false) || (ci_00.value_ == 0xffffffff)) {
        lVar5 = 0;
        if (lVar8 != 2) {
          lVar5 = lVar8 + 1;
        }
        local_50.value_ =
             *(uint *)((long)&(local_40->corner_to_vertex_map_).vector_.
                              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar5 * 4);
        if (this->pos_att_->identity_mapping_ == false) {
          local_50.value_ =
               (this->pos_att_->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_50.value_].value_;
        }
        local_4c = *(undefined4 *)
                    ((long)local_48 +
                    lVar8 * 4 +
                    (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) * -3)
        ;
        ct = (CornerTable *)&stack0xffffffffffffffb0;
        std::
        _Rb_tree<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>,std::_Select1st<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>,std::less<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>>
        ::
        _M_insert_unique<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>
                  ((_Rb_tree<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>,std::_Select1st<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>,std::less<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>>
                    *)polygon_edges,
                   (pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
                    *)ct);
      }
      else {
        ct = (CornerTable *)((ulong)ci_00.value_ / 3);
        FindOriginalFaceEdges
                  (this,(FaceIndex)(ci_00.value_ / 3),corner_table,local_38,polygon_edges);
      }
      lVar8 = lVar8 + 1;
      uVar7 = uVar7 + 1;
    } while (lVar8 != 3);
  }
  return;
}

Assistant:

void ObjEncoder::FindOriginalFaceEdges(FaceIndex face_index,
                                       const CornerTable &corner_table,
                                       std::vector<bool> *triangle_visited,
                                       PolygonEdges *polygon_edges) {
  // Do not add any edges if this triangular face has already been visited.
  if ((*triangle_visited)[face_index.value()]) {
    return;
  }
  (*triangle_visited)[face_index.value()] = true;
  const Mesh::Face &face = in_mesh_->face(face_index);
  for (size_t c = 0; c < 3; c++) {
    // Check for added edge using this corner.
    const CornerIndex ci = corner_table.FirstCorner(face_index) + c;
    const CornerIndex co = corner_table.Opposite(ci);
    bool is_new_edge = IsNewEdge(corner_table, ci);

    // Check for the new edge using the opposite corner.
    if (!is_new_edge && co != kInvalidCornerIndex) {
      is_new_edge = IsNewEdge(corner_table, co);
    }
    // The new edge may become a boundary edge when a degenerate triangle
    // created by polygon triangulation is removed by Draco encoder, hence |co|
    // is checked below. This can happen when an isolated (boundary) quad only
    // has three distinct vertex positions.
    //
    // TODO(vytyaz): Fix polygon reconstruction with other possible cases of
    // degenerate triangles. There are two known sources of degenerate triangles
    // that affect polygon reconstruction:
    //
    // 1. Degenerate triangles created during polygon triangulation are removed
    //    by Draco encoder, which invalidates the "added_edges" attribute.
    //    Solution is to discard those triangles before creating the attribute.
    //
    // 2. Degenerate triangles created by position quantization are encoded and
    //    decoded by Draco, but not captured into the |corner_table|, causing a
    //    mismatch between the corner table and the "added_edges" attribute.
    //    Solution is to use corner table from draco::MeshDecoder here.
    //
    if (is_new_edge && co != kInvalidCornerIndex) {
      // Visit triangle across the new edge.
      const FaceIndex opposite_face_index = corner_table.Face(co);
      FindOriginalFaceEdges(opposite_face_index, corner_table, triangle_visited,
                            polygon_edges);
    } else {
      // Insert the original edge to the map.
      const PointIndex point_from = face[(c + 1) % 3];
      const PointIndex point_to = face[(c + 2) % 3];
      polygon_edges->insert(
          {PositionIndex(pos_att_->mapped_index(point_from)), point_to});
    }
  }
}